

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPFakeTransmitter::AddLoopbackAddress(RTPFakeTransmitter *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)&this->localIPs;
  do {
    p_Var2 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var2->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->localIPs) {
      p_Var2 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var2[1]._M_next = 0x7f000001;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      psVar1 = &(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return;
    }
  } while (*(int *)&p_Var2[1]._M_next != 0x7f000001);
  return;
}

Assistant:

void RTPFakeTransmitter::AddLoopbackAddress()
{
	uint32_t loopbackaddr = (((uint32_t)127)<<24)|((uint32_t)1);
	std::list<uint32_t>::const_iterator it;
	bool found = false;
	
	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if (*it == loopbackaddr)
			found = true;
	}

	if (!found)
		localIPs.push_back(loopbackaddr);
}